

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belakang.h
# Opt level: O1

void __thiscall Belakang::Belakang(Belakang *this)

{
  Polygon::Polygon(&this->super_Polygon);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Belakang() {
    addPoint(Point<double>(0,0));
    addPoint(Point<double>(0,600));
    addPoint(Point<double>(800,600));
    addPoint(Point<double>(800,0));
  }